

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O1

void cmsys::SystemTools::CheckTranslationPath(string *path)

{
  pointer pcVar1;
  size_type sVar2;
  long lVar3;
  _Rb_tree_node_base *p_Var4;
  
  if (1 < path->_M_string_length) {
    std::__cxx11::string::append((char *)path);
    for (p_Var4 = *(_Rb_tree_node_base **)(TranslationMap + 0x18);
        p_Var4 != (_Rb_tree_node_base *)(TranslationMap + 8);
        p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
      lVar3 = std::__cxx11::string::find((char *)path,*(ulong *)(p_Var4 + 1),0);
      if (lVar3 == 0) {
        std::__cxx11::string::replace
                  ((ulong)path,0,(char *)p_Var4[1]._M_parent,*(ulong *)(p_Var4 + 2));
        std::__cxx11::string::_M_assign((string *)path);
      }
    }
    pcVar1 = (path->_M_dataplus)._M_p;
    sVar2 = path->_M_string_length;
    path->_M_string_length = sVar2 - 1;
    pcVar1[sVar2 - 1] = '\0';
  }
  return;
}

Assistant:

void SystemTools::CheckTranslationPath(std::string& path)
{
  // Do not translate paths that are too short to have meaningful
  // translations.
  if (path.size() < 2) {
    return;
  }

  // Always add a trailing slash before translation.  It does not
  // matter if this adds an extra slash, but we do not want to
  // translate part of a directory (like the foo part of foo-dir).
  path += "/";

  // In case a file was specified we still have to go through this:
  // Now convert any path found in the table back to the one desired:
  std::map<std::string, std::string>::const_iterator it;
  for (it = SystemTools::TranslationMap->begin();
       it != SystemTools::TranslationMap->end(); ++it) {
    // We need to check of the path is a substring of the other path
    if (path.find(it->first) == 0) {
      path = path.replace(0, it->first.size(), it->second);
    }
  }

  // Remove the trailing slash we added before.
  path.erase(path.end() - 1, path.end());
}